

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void tcp_recv_cb(ev_loop *loop,ev_io *w,int revents)

{
  uint uVar1;
  ssize_t sVar2;
  size_t sVar3;
  char *pcVar4;
  relay_ctx_t *relay_ctx;
  undefined1 local_2038 [4];
  socklen_t saddr_len;
  sockaddr_in saddr;
  char buffer [8192];
  int bsize;
  int rx;
  int revents_local;
  ev_io *w_local;
  ev_loop *loop_local;
  
  buffer[0x1ffc] = -0x18;
  buffer[0x1ffd] = '\x05';
  buffer[0x1ffe] = '\0';
  buffer[0x1fff] = '\0';
  sVar2 = recv(w[-1].fd,saddr.sin_zero,0x5e8,0);
  if ((int)sVar2 < 1) {
    remove_relay_ctx(loop,(relay_ctx_t *)&w[-1].fd);
  }
  else {
    ev_timer_again(loop,(ev_timer *)(w + 2));
    ezbuf_put(*(ezbuf_t **)(w + 3),(char *)saddr.sin_zero,(int)sVar2);
    memset(local_2038,0,0x10);
    local_2038._0_2_ = 2;
    local_2038._2_2_ = htons((uint16_t)*(undefined4 *)(*(long *)&w[4].fd + 0x44));
    saddr_len = inet_addr((char *)(*(long *)&w[4].fd + 0x20));
    while (sVar3 = ezbuf_size(*(ezbuf_t **)(w + 3)), (ulong)(long)(int)buffer._8188_4_ <= sVar3) {
      sVar3 = ezbuf_get(*(ezbuf_t **)(w + 3),(char *)saddr.sin_zero,buffer._8188_4_);
      buffer._8188_4_ = (undefined4)sVar3;
      uVar1 = unpack((char *)saddr.sin_zero,buffer._8188_4_,(char *)saddr.sin_zero);
      pcVar4 = inet_ntoa((in_addr)*(in_addr_t *)((long)&w[3].data + 4));
      ntohs(*(uint16_t *)((long)&w[3].data + 2));
      vlog("[tcp] recv(%d) from %s:%d\n",(ulong)uVar1,pcVar4);
      sendto(*(int *)((long)&w[3].next + 4),saddr.sin_zero,(long)(int)uVar1,0,(sockaddr *)local_2038
             ,0x10);
    }
  }
  return;
}

Assistant:

static void tcp_recv_cb(EV_P_ ev_io *w, int revents)
{
    int rx, bsize;
    char buffer[EZBUF_MAX];
    struct sockaddr_in saddr;
    socklen_t saddr_len;

    relay_ctx_t *relay_ctx;
    relay_ctx = obj_entry(w, relay_ctx_t, recv_io);

    bsize = sizeof(package_t);

    rx = recv(relay_ctx->tcp_fd, buffer, bsize, 0);
    if (rx <= 0)
    {
        remove_relay_ctx(EV_A, relay_ctx);
        return;
    }

    ev_timer_again(EV_A_ &relay_ctx->timeout);

    ezbuf_put(relay_ctx->recv_buf, buffer, rx);

    memset(&saddr, 0, sizeof(saddr));
    saddr.sin_family = AF_INET;
    saddr.sin_port = htons(relay_ctx->cfg->serv_port);;
    saddr.sin_addr.s_addr = inet_addr(relay_ctx->cfg->serv_addr);
    saddr_len = sizeof(saddr);

    while(1){
        if (ezbuf_size(relay_ctx->recv_buf) < bsize)
            break;

        bsize = ezbuf_get(relay_ctx->recv_buf, buffer, bsize);
        rx = unpack(buffer, bsize, buffer);
        vlog("[tcp] recv(%d) from %s:%d\n", rx, inet_ntoa(relay_ctx->src_addr.sin_addr), ntohs(relay_ctx->src_addr.sin_port));

        sendto(
            relay_ctx->udp_fd,
            buffer,
            rx,
            0,
            (struct sockaddr *)&saddr,
            saddr_len
        );
    }
}